

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_finish_popup(nk_context *ctx,nk_window *win)

{
  nk_panel *local_28;
  nk_panel *iter;
  nk_popup_buffer *buf;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3f1c,"void nk_finish_popup(struct nk_context *, struct nk_window *)");
  }
  if (win == (nk_window *)0x0) {
    __assert_fail("win",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x3f1d,"void nk_finish_popup(struct nk_context *, struct nk_window *)");
  }
  if ((ctx != (nk_context *)0x0) && (win != (nk_window *)0x0)) {
    for (local_28 = win->layout; local_28->parent != (nk_panel *)0x0; local_28 = local_28->parent) {
    }
    (local_28->popup_buffer).last = (win->buffer).last;
    (local_28->popup_buffer).end = (win->buffer).end;
  }
  return;
}

Assistant:

NK_INTERN void
nk_finish_popup(struct nk_context *ctx, struct nk_window *win)
{
    struct nk_popup_buffer *buf;
    struct nk_panel *iter;
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!ctx || !win) return;

    /* make sure to use the correct popup buffer*/
    iter = win->layout;
    while (iter->parent)
        iter = iter->parent;

    buf = &iter->popup_buffer;
    buf->last = win->buffer.last;
    buf->end = win->buffer.end;
}